

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnCallIndirectExpr
          (BinaryReaderIR *this,Index sig_index,Index table_index)

{
  Result RVar1;
  Expr *local_f0;
  _Head_base<0UL,_wabt::Expr_*,_false> local_e8;
  Location local_e0;
  Var local_c0;
  Var local_78;
  
  std::make_unique<wabt::CallIndirectExpr>();
  GetLocation(&local_c0.loc,this);
  Var::Var(&local_78,sig_index,&local_c0.loc);
  SetFuncDeclaration(this,(FuncDeclaration *)(local_f0 + 1),&local_78);
  Var::~Var(&local_78);
  GetLocation(&local_e0,this);
  Var::Var(&local_c0,table_index,&local_e0);
  Var::operator=((Var *)(local_f0 + 3),&local_c0);
  Var::~Var(&local_c0);
  local_e8._M_head_impl = local_f0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_e8);
  if (local_e8._M_head_impl != (Expr *)0x0) {
    (*(local_e8._M_head_impl)->_vptr_Expr[1])();
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnCallIndirectExpr(Index sig_index, Index table_index) {
  auto expr = std::make_unique<CallIndirectExpr>();
  SetFuncDeclaration(&expr->decl, Var(sig_index, GetLocation()));
  expr->table = Var(table_index, GetLocation());
  return AppendExpr(std::move(expr));
}